

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

void __thiscall Array::~Array(Array *this)

{
  int iVar1;
  long lVar2;
  
  this->_vptr_Array = (_func_int **)&PTR__Array_00104d08;
  iVar1 = this->_height;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (this->_data[lVar2] != (int *)0x0) {
        operator_delete__(this->_data[lVar2]);
        iVar1 = this->_height;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->_data != (int **)0x0) {
    operator_delete__(this->_data);
    return;
  }
  return;
}

Assistant:

Array::~Array()
{
	for (int i = 0; i < _height; ++i) {
			delete[] _data[i];
	}

	delete[] _data;
}